

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O2

int IteratorCubePairNext(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  iVar2 = s_Iter_4;
  iVar1 = s_nPosAlloc;
  if (s_Iter_0 == '\0') {
    __assert_fail("s_Iter.fStarted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x435,"int IteratorCubePairNext()");
  }
  uVar3 = (ulong)s_Iter_1;
  iVar4 = s_Que[uVar3].PosOut;
  pQ = s_Que + uVar3;
  while( true ) {
    if (iVar4 == iVar2) {
      s_Iter_0 = 0;
      return 0;
    }
    p1 = s_Que[uVar3].pC1[iVar4];
    p2 = s_Que[uVar3].pC2[iVar4];
    if ((p1->ID == s_Que[uVar3].ID1[iVar4]) && (p2->ID == s_Que[uVar3].ID2[iVar4])) break;
    iVar4 = (iVar4 + 1) % iVar1;
    s_Que[uVar3].PosOut = iVar4;
  }
  *s_Iter_2 = (long)p1;
  *s_Iter_3 = s_Que[uVar3].pC2[iVar4];
  s_Que[uVar3].PosOut = (iVar4 + 1) % iVar1;
  return 1;
}

Assistant:

int IteratorCubePairNext()
// gives the next VALID cube pair (the previous one is automatically dequequed)
{
    int fEntryFound = 0;
    assert( s_Iter.fStarted );

    // go through the entries while there is something in the queque
    for ( pQ = &s_Que[ s_Iter.Dist ]; pQ->PosOut != s_Iter.PosStop; pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc )
    {
        p1 = pQ->pC1[ pQ->PosOut ];
        p2 = pQ->pC2[ pQ->PosOut ];

        // check whether the entry is valid
        if ( p1->ID == pQ->ID1[ pQ->PosOut ] && 
             p2->ID == pQ->ID2[ pQ->PosOut ] ) //&&
             //p1->x + p1->y + p2->x + p2->y > s_Iter.CutValue )
        {
             fEntryFound = 1;
             break;
        }
    }

    if ( fEntryFound )
    { // write the result into the pick-up place
        *(s_Iter.ppC1) = pQ->pC1[ pQ->PosOut ];
        *(s_Iter.ppC2) = pQ->pC2[ pQ->PosOut ];

        pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc;
    }
    else // iteration has finished
        s_Iter.fStarted = 0;

    return fEntryFound;
}